

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteAiger.c
# Opt level: O3

Vec_Str_t * Io_WriteEncodeLiterals(Vec_Int_t *vLits)

{
  int iVar1;
  bool bVar2;
  Vec_Str_t *pVVar3;
  char *__ptr;
  uint uVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  byte *pbVar9;
  int iVar10;
  
  iVar1 = vLits->nSize;
  pVVar3 = (Vec_Str_t *)malloc(0x10);
  iVar8 = 0x10;
  if (0xe < iVar1 * 2 - 1U) {
    iVar8 = iVar1 * 2;
  }
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar8;
  if (iVar8 == 0) {
    __ptr = (char *)0x0;
  }
  else {
    __ptr = (char *)malloc((long)iVar8);
  }
  pVVar3->pArray = __ptr;
  if (iVar1 < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  uVar4 = *vLits->pArray;
  lVar5 = 0;
  uVar7 = uVar4;
  if (0x7f < uVar4) {
    lVar5 = 0;
    uVar6 = uVar4;
    do {
      __ptr[lVar5] = (byte)uVar6 | 0x80;
      lVar5 = lVar5 + 1;
      uVar7 = uVar6 >> 7;
      bVar2 = 0x3fff < uVar6;
      uVar6 = uVar7;
    } while (bVar2);
  }
  __ptr[(int)lVar5] = (char)uVar7;
  iVar10 = (int)lVar5 + 1;
  if (iVar1 != 1) {
    lVar5 = 1;
    do {
      uVar7 = vLits->pArray[lVar5];
      iVar1 = uVar7 - uVar4;
      if ((int)uVar7 < (int)uVar4) {
        iVar1 = -(uVar7 - uVar4);
      }
      uVar4 = (uint)((int)uVar7 < (int)uVar4) + iVar1 * 2;
      if (0x7f < (uint)(iVar1 * 2)) {
        pbVar9 = (byte *)(__ptr + iVar10);
        uVar6 = uVar4;
        do {
          *pbVar9 = (byte)uVar6 | 0x80;
          uVar4 = uVar6 >> 7;
          pbVar9 = pbVar9 + 1;
          iVar10 = iVar10 + 1;
          bVar2 = 0x3fff < uVar6;
          uVar6 = uVar4;
        } while (bVar2);
      }
      __ptr[iVar10] = (char)uVar4;
      if (iVar8 < iVar10 + 0xb) {
        iVar8 = iVar8 + 1;
        __ptr = (char *)realloc(__ptr,(long)iVar8);
      }
      lVar5 = lVar5 + 1;
      iVar10 = iVar10 + 1;
      uVar4 = uVar7;
    } while (lVar5 < vLits->nSize);
    pVVar3->pArray = __ptr;
    pVVar3->nCap = iVar8;
  }
  pVVar3->nSize = iVar10;
  return pVVar3;
}

Assistant:

Vec_Str_t * Io_WriteEncodeLiterals( Vec_Int_t * vLits )
{
    Vec_Str_t * vBinary;
    int Pos = 0, Lit, LitPrev, Diff, i;
    vBinary = Vec_StrAlloc( 2 * Vec_IntSize(vLits) );
    LitPrev = Vec_IntEntry( vLits, 0 );
    Pos = Io_WriteAigerEncode( (unsigned char *)Vec_StrArray(vBinary), Pos, LitPrev ); 
    Vec_IntForEachEntryStart( vLits, Lit, i, 1 )
    {
        Diff = Lit - LitPrev;
        Diff = (Lit < LitPrev)? -Diff : Diff;
        Diff = (Diff << 1) | (int)(Lit < LitPrev);
        Pos = Io_WriteAigerEncode( (unsigned char *)Vec_StrArray(vBinary), Pos, Diff );
        LitPrev = Lit;
        if ( Pos + 10 > vBinary->nCap )
            Vec_StrGrow( vBinary, vBinary->nCap+1 );
    }
    vBinary->nSize = Pos;
/*
    // verify
    {
        extern Vec_Int_t * Io_WriteDecodeLiterals( char ** ppPos, int nEntries );
        char * pPos = Vec_StrArray( vBinary );
        Vec_Int_t * vTemp = Io_WriteDecodeLiterals( &pPos, Vec_IntSize(vLits) );
        for ( i = 0; i < Vec_IntSize(vLits); i++ )
        {
            int Entry1 = Vec_IntEntry(vLits,i);
            int Entry2 = Vec_IntEntry(vTemp,i);
            assert( Entry1 == Entry2 );
        }
    }
*/
    return vBinary;
}